

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O2

sexp sexp_string_concatenate_op(sexp ctx,sexp self,sexp_sint_t n,sexp str_ls,sexp sep)

{
  sexp psVar1;
  size_t __n;
  long lVar2;
  sexp psVar3;
  long lVar4;
  char *__dest;
  sexp_uint_t __n_00;
  void *__src;
  
  lVar4 = 1;
  lVar2 = 0;
  psVar3 = str_ls;
  while( true ) {
    if ((((ulong)psVar3 & 3) != 0) || (psVar3->tag != 6)) {
      if (((((ulong)sep & 3) == 0 && lVar4 != 1) && (sep->tag == 9)) &&
         (__n_00 = (sep->value).string.length, __n_00 != 0)) {
        __src = (void *)((long)&((sep->value).type.cpl)->value +
                        (long)&((sep->value).type.name)->value);
        lVar2 = lVar2 - lVar4 * __n_00;
      }
      else {
        __n_00 = 0;
        __src = (void *)0x0;
      }
      psVar3 = sexp_make_string_op(ctx,(sexp)0x0,2,(sexp)(lVar2 * 2 + 1),(sexp)&DAT_0000043e);
      __dest = (((psVar3->value).type.cpl)->value).flonum_bits +
               (long)(((psVar3->value).type.name)->value).flonum_bits;
      for (; (((ulong)str_ls & 3) == 0 && (str_ls->tag == 6)); str_ls = (str_ls->value).type.cpl) {
        psVar1 = (str_ls->value).type.name;
        __n = (psVar1->value).string.length;
        memcpy(__dest,(void *)((long)&((psVar1->value).type.cpl)->value +
                              (long)&((psVar1->value).type.name)->value),__n);
        __dest = __dest + __n;
        if ((__n_00 != 0) &&
           ((psVar1 = (str_ls->value).type.cpl, ((ulong)psVar1 & 3) == 0 && (psVar1->tag == 6)))) {
          memcpy(__dest,__src,__n_00);
          __dest = __dest + __n_00;
        }
      }
      *__dest = '\0';
      return psVar3;
    }
    psVar1 = (psVar3->value).type.name;
    if ((((ulong)psVar1 & 3) != 0) || (psVar1->tag != 9)) break;
    lVar2 = (long)&((psVar1->value).type.slots)->tag + lVar2;
    psVar3 = (psVar3->value).type.cpl;
    lVar4 = lVar4 + -1;
  }
  psVar3 = sexp_type_exception(ctx,self,9,psVar1);
  return psVar3;
}

Assistant:

sexp sexp_string_concatenate_op (sexp ctx, sexp self, sexp_sint_t n, sexp str_ls, sexp sep) {
  sexp res, ls;
  sexp_uint_t len=0, i=0, sep_len=0;
  char *p, *csep=NULL;
  for (ls=str_ls; sexp_pairp(ls); ls=sexp_cdr(ls), i++)
    if (! sexp_stringp(sexp_car(ls)))
      return sexp_type_exception(ctx, self, SEXP_STRING, sexp_car(ls));
    else
      len += sexp_string_size(sexp_car(ls));
  if ((i > 0) && sexp_stringp(sep) && ((sep_len=sexp_string_size(sep)) > 0)) {
    csep = sexp_string_data(sep);
    len += sep_len*(i-1);
  }
  res = sexp_make_string(ctx, sexp_make_fixnum(len), SEXP_VOID);
  p = sexp_string_data(res);
  for (ls=str_ls; sexp_pairp(ls); ls=sexp_cdr(ls)) {
    len = sexp_string_size(sexp_car(ls));
    memcpy(p, sexp_string_data(sexp_car(ls)), len);
    p += len;
    if (sep_len && sexp_pairp(sexp_cdr(ls))) {
      memcpy(p, csep, sep_len);
      p += sep_len;
    }
  }
  *p = '\0';
  sexp_update_string_index_lookup(ctx, res);
  return res;
}